

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# artifact.c
# Opt level: O0

void set_artifact_intrinsic(obj *otmp,boolean on,long wp_mask,boolean side_effects)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  artifact *local_b0;
  unsigned_long local_a8;
  artifact *local_a0;
  artifact *local_98;
  artifact *local_88;
  artifact *art_2;
  obj *obj_2;
  artifact *art_1;
  obj *obj_1;
  artifact *art;
  obj *obj;
  boolean spfx_aggravate;
  boolean spfx_hunger;
  boolean spfx_fumbling;
  ulong uStack_48;
  boolean spfx_stlth;
  long spfx;
  uchar dtyp;
  artifact *oart;
  uint *mask;
  boolean side_effects_local;
  long wp_mask_local;
  boolean on_local;
  obj *otmp_local;
  
  oart = (artifact *)0x0;
  if ((otmp == (obj *)0x0) || (otmp->oartifact == '\0')) {
    local_88 = (artifact *)0x0;
  }
  else {
    local_88 = artilist + (int)otmp->oartifact;
  }
  bVar5 = false;
  bVar6 = false;
  bVar7 = false;
  bVar8 = false;
  if ((local_88 != (artifact *)0x0) || (otmp->oprops != 0)) {
    if (local_88 == (artifact *)0x0) {
      spfx._7_1_ = '\0';
    }
    else if (wp_mask == 0x1000) {
      spfx._7_1_ = (local_88->cary).adtyp;
    }
    else {
      spfx._7_1_ = (local_88->defn).adtyp;
    }
    if (spfx._7_1_ == '\x02') {
      oart = (artifact *)(u.uprops + 1);
    }
    else if (spfx._7_1_ == '\x03') {
      oart = (artifact *)(u.uprops + 2);
    }
    else if (spfx._7_1_ == '\x06') {
      oart = (artifact *)(u.uprops + 5);
    }
    else if (spfx._7_1_ == '\x01') {
      oart = (artifact *)(u.uprops + 0x2c);
    }
    else if (spfx._7_1_ == '\x05') {
      oart = (artifact *)(u.uprops + 4);
    }
    else if (spfx._7_1_ == '\a') {
      oart = (artifact *)(u.uprops + 6);
    }
    if (((oart != (artifact *)0x0) && (wp_mask == 0x1000)) && (on == '\0')) {
      for (art = (artifact *)invent; art != (artifact *)0x0; art = (artifact *)art->name) {
        if (((obj *)art != otmp) && (*(char *)((long)&art->role + 1) != '\0')) {
          if ((art == (artifact *)0x0) || (*(char *)((long)&art->role + 1) == '\0')) {
            local_98 = (artifact *)0x0;
          }
          else {
            local_98 = artilist + (int)*(char *)((long)&art->role + 1);
          }
          if (((local_98->cary).adtyp == spfx._7_1_) ||
             ((spfx._7_1_ == '\x01' && (bVar2 = is_quest_artifact((obj *)art), bVar2 != '\0')))) {
            oart = (artifact *)0x0;
            break;
          }
        }
      }
    }
    uVar1 = (uint)wp_mask;
    if (oart != (artifact *)0x0) {
      if (on == '\0') {
        *(uint *)&oart->name = *(uint *)&oart->name & (uVar1 ^ 0xffffffff);
      }
      else {
        *(uint *)&oart->name = *(uint *)&oart->name | uVar1;
      }
    }
    bVar2 = is_quest_artifact(otmp);
    if ((bVar2 != '\0') && (wp_mask == 0x1000)) {
      if (on == '\0') {
        for (art_1 = (artifact *)invent; art_1 != (artifact *)0x0; art_1 = (artifact *)art_1->name)
        {
          if (((obj *)art_1 != otmp) && (*(char *)((long)&art_1->role + 1) != '\0')) {
            if ((art_1 == (artifact *)0x0) || (*(char *)((long)&art_1->role + 1) == '\0')) {
              local_a0 = (artifact *)0x0;
            }
            else {
              local_a0 = artilist + (int)*(char *)((long)&art_1->role + 1);
            }
            if ((local_a0->cary).adtyp == '\x01') break;
          }
        }
        if (art_1 == (artifact *)0x0) {
          u.uprops[0x2c].extrinsic = u.uprops[0x2c].extrinsic & 0xffffefff;
        }
      }
      else {
        u.uprops[0x2c].extrinsic = u.uprops[0x2c].extrinsic | 0x1000;
      }
    }
    uStack_48 = 0;
    if (local_88 == (artifact *)0x0) {
      if (((wp_mask == 0x100) || ((wp_mask == 0x400 && ((u.twoweap != '\0' || (on == '\0')))))) &&
         (((otmp->oclass == '\x02' ||
           ((otmp->oclass == '\x06' && (objects[otmp->otyp].oc_subtyp != '\0')))) &&
          ((((otmp->oclass != '\x02' && (otmp->oclass != '\r')) ||
            ((objects[otmp->otyp].oc_subtyp < -0x18 || (-0x16 < objects[otmp->otyp].oc_subtyp)))) &&
           (((otmp->oclass != '\x02' && (otmp->oclass != '\x06')) ||
            ((objects[otmp->otyp].oc_subtyp < -0x1b || (-0x19 < objects[otmp->otyp].oc_subtyp)))))))
          ))) {
        if ((otmp->oprops & 0x10U) != 0) {
          uStack_48 = 0x4000000;
        }
        if ((otmp->oprops & 0x400U) != 0) {
          uStack_48 = uStack_48 | 0x1000;
        }
        if ((otmp->oprops & 0x1000U) != 0) {
          uStack_48 = uStack_48 | 0x200;
        }
        if ((otmp->oprops & 0x2000U) != 0) {
          uStack_48 = uStack_48 | 0x20;
        }
        bVar5 = (otmp->oprops & 0x4000U) != 0;
        bVar6 = (otmp->oprops & 0x8000U) != 0;
        bVar7 = (otmp->oprops & 0x40000U) != 0;
        bVar8 = (otmp->oprops & 0x80000U) != 0;
      }
    }
    else {
      if (wp_mask == 0x1000) {
        local_a8 = local_88->cspfx;
      }
      else {
        local_a8 = local_88->spfx;
      }
      uStack_48 = local_a8;
    }
    if (((uStack_48 != 0) && (wp_mask == 0x1000)) && (on == '\0')) {
      for (art_2 = (artifact *)invent; art_2 != (artifact *)0x0; art_2 = (artifact *)art_2->name) {
        if (((obj *)art_2 != otmp) && (*(char *)((long)&art_2->role + 1) != '\0')) {
          if ((art_2 == (artifact *)0x0) || (*(char *)((long)&art_2->role + 1) == '\0')) {
            local_b0 = (artifact *)0x0;
          }
          else {
            local_b0 = artilist + (int)*(char *)((long)&art_2->role + 1);
          }
          uStack_48 = (local_b0->cspfx ^ 0xffffffffffffffff) & uStack_48;
        }
      }
    }
    if ((uStack_48 & 0x200) != 0) {
      if (on == '\0') {
        u.uprops[0xb].extrinsic = u.uprops[0xb].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[0xb].extrinsic = u.uprops[0xb].extrinsic | uVar1;
      }
    }
    if ((uStack_48 & 0x800) != 0) {
      make_hallucinated((long)(int)(uint)((on != '\0' ^ 0xffU) & 1),side_effects,wp_mask);
    }
    if ((uStack_48 & 0x1000) != 0) {
      if (on == '\0') {
        u.uprops[0x19].extrinsic = u.uprops[0x19].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[0x19].extrinsic = u.uprops[0x19].extrinsic | uVar1;
      }
      see_monsters();
    }
    if (bVar5) {
      if (on == '\0') {
        u.uprops[0x13].extrinsic = u.uprops[0x13].extrinsic & (uVar1 ^ 0xffffffff);
        if (((side_effects != '\0') && (u.uprops[0x13].extrinsic == 0)) &&
           ((u.uprops[0x13].intrinsic == 0 &&
            ((u.uprops[0x13].blocked == 0 &&
             (pline("You sure are noisy."), (otmp->oprops & 0x4000U) != 0)))))) {
          otmp->oprops_known = otmp->oprops_known | 0x4000;
        }
      }
      else {
        if ((((side_effects != '\0') && (u.uprops[0x13].extrinsic == 0)) &&
            (u.uprops[0x13].intrinsic == 0)) &&
           ((u.uprops[0x13].blocked == 0 &&
            (pline("You move very quietly."), (otmp->oprops & 0x4000U) != 0)))) {
          otmp->oprops_known = otmp->oprops_known | 0x4000;
        }
        u.uprops[0x13].extrinsic = u.uprops[0x13].extrinsic | uVar1;
      }
    }
    if (bVar6) {
      if (on == '\0') {
        u.uprops[0x25].extrinsic = u.uprops[0x25].extrinsic & (uVar1 ^ 0xffffffff);
        if ((u.uprops[0x25].extrinsic == 0) &&
           ((u.uprops[0x25].intrinsic & 0xff000000) != 0xffffffff)) {
          u.uprops[0x25].extrinsic = 0;
          u.uprops[0x25].intrinsic = 0;
        }
      }
      else {
        if ((u.uprops[0x25].extrinsic == 0) && ((u.uprops[0x25].intrinsic & 0xff000000) == 0)) {
          iVar3 = rnd(0x14);
          incr_itimeout(&u.uprops[0x25].intrinsic,(long)iVar3);
        }
        u.uprops[0x25].extrinsic = u.uprops[0x25].extrinsic | uVar1;
      }
    }
    if (bVar7) {
      if (on == '\0') {
        u.uprops[0x28].extrinsic = u.uprops[0x28].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[0x28].extrinsic = u.uprops[0x28].extrinsic | uVar1;
      }
    }
    if (bVar8) {
      if (on == '\0') {
        u.uprops[0x14].extrinsic = u.uprops[0x14].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[0x14].extrinsic = u.uprops[0x14].extrinsic | uVar1;
      }
    }
    if ((uStack_48 & 0x2000) != 0) {
      if (on == '\0') {
        u.uprops[0x2d].extrinsic = u.uprops[0x2d].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[0x2d].extrinsic = u.uprops[0x2d].extrinsic | uVar1;
      }
    }
    if ((uStack_48 & 0x4000) != 0) {
      if (on == '\0') {
        u.uprops[10].extrinsic = u.uprops[10].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[10].extrinsic = u.uprops[10].extrinsic | uVar1;
      }
    }
    if ((uStack_48 & 0x40000) != 0) {
      if (on == '\0') {
        u.uprops[0xf].extrinsic = u.uprops[0xf].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[0xf].extrinsic = u.uprops[0xf].extrinsic | uVar1;
      }
    }
    if ((uStack_48 & 0x20) != 0) {
      lVar4 = spec_m2(otmp);
      if (lVar4 == 0) {
        if (on == '\0') {
          u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic & (uVar1 ^ 0xffffffff);
        }
        else {
          u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic | uVar1;
        }
      }
      else if (on == '\0') {
        u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic & (uVar1 ^ 0xffffffff);
        lVar4 = spec_m2(otmp);
        flags.warntype = flags.warntype & ((uint)lVar4 ^ 0xffffffff);
      }
      else {
        u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic | uVar1;
        lVar4 = spec_m2(otmp);
        flags.warntype = flags.warntype | (uint)lVar4;
      }
      see_monsters();
    }
    if ((uStack_48 & 0x8000000) != 0) {
      if (local_88->mtype == 0) {
        if (on == '\0') {
          u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic & (uVar1 ^ 0xffffffff);
        }
        else {
          u.uprops[0x18].extrinsic = u.uprops[0x18].extrinsic | uVar1;
        }
      }
      else if (on == '\0') {
        u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[0x41].extrinsic = u.uprops[0x41].extrinsic | uVar1;
      }
      see_monsters();
    }
    if ((uStack_48 & 0x8000) != 0) {
      if (on == '\0') {
        u.uprops[0x30].extrinsic = u.uprops[0x30].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[0x30].extrinsic = u.uprops[0x30].extrinsic | uVar1;
      }
    }
    if ((uStack_48 & 0x10000) != 0) {
      if (on == '\0') {
        u.uprops[0x32].extrinsic = u.uprops[0x32].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[0x32].extrinsic = u.uprops[0x32].extrinsic | uVar1;
      }
    }
    if ((uStack_48 & 0x20000) != 0) {
      if (on == '\0') {
        u.uprops[0x33].extrinsic = u.uprops[0x33].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[0x33].extrinsic = u.uprops[0x33].extrinsic | uVar1;
      }
    }
    if ((uStack_48 & 0x2000000) != 0) {
      if (on == '\0') {
        u.xray_range = -1;
      }
      else {
        u.xray_range = 3;
      }
      vision_full_recalc = '\x01';
    }
    if (((uStack_48 & 0x4000000) != 0) && ((wp_mask & 0x500U) != 0)) {
      if (on == '\0') {
        u.uprops[0x2a].extrinsic = u.uprops[0x2a].extrinsic & (uVar1 ^ 0xffffffff);
      }
      else {
        u.uprops[0x2a].extrinsic = u.uprops[0x2a].extrinsic | uVar1;
      }
    }
    if ((((wp_mask == 0x1000) && (on == '\0')) && (local_88 != (artifact *)0x0)) &&
       (((local_88->inv_prop != '\0' && (local_88->inv_prop < 0x43)) &&
        ((u.uprops[local_88->inv_prop].extrinsic & 0x2000) != 0)))) {
      arti_invoke(otmp);
    }
  }
  return;
}

Assistant:

void set_artifact_intrinsic(struct obj *otmp, boolean on, long wp_mask,
			    boolean side_effects)
{
	unsigned int *mask = 0;
	const struct artifact *oart = get_artifact(otmp);
	uchar dtyp;
	long spfx;
	boolean spfx_stlth = FALSE;	/* we ran out of SPFX_* bits, so... */
	boolean spfx_fumbling = FALSE;
	boolean spfx_hunger = FALSE;
	boolean spfx_aggravate = FALSE;

	if (!oart && !otmp->oprops)
	    return;

	/* effects from the defn field */
	if (oart)
	    dtyp = (wp_mask != W_ART) ? oart->defn.adtyp : oart->cary.adtyp;
	else
	    dtyp = 0;

	if (dtyp == AD_FIRE)
	    mask = &EFire_resistance;
	else if (dtyp == AD_COLD)
	    mask = &ECold_resistance;
	else if (dtyp == AD_ELEC)
	    mask = &EShock_resistance;
	else if (dtyp == AD_MAGM)
	    mask = &EAntimagic;
	else if (dtyp == AD_DISN)
	    mask = &EDisint_resistance;
	else if (dtyp == AD_DRST)
	    mask = &EPoison_resistance;

	if (mask && wp_mask == W_ART && !on) {
	    /* find out if some other artifact also confers this intrinsic */
	    /* if so, leave the mask alone */
	    struct obj* obj;
	    for (obj = invent; obj; obj = obj->nobj)
		if (obj != otmp && obj->oartifact) {
		    const struct artifact *art = get_artifact(obj);
		    if (art->cary.adtyp == dtyp ||
			(dtyp == AD_MAGM && is_quest_artifact(obj))) {
			mask = NULL;
			break;
		    }
		}
	}
	if (mask) {
	    if (on) *mask |= wp_mask;
	    else *mask &= ~wp_mask;
	}

	/* quest artifact grants magic resistance when carried by their role */
	if (is_quest_artifact(otmp) && wp_mask == W_ART) {
	    if (on) {
		EAntimagic |= W_ART;
	    } else {
		/* don't take away magic resistance if another artifact grants it */
		struct obj *obj;
		for (obj = invent; obj; obj = obj->nobj) {
		    if (obj != otmp && obj->oartifact) {
			const struct artifact *art = get_artifact(obj);
			if (art->cary.adtyp == AD_MAGM) break;
		    }
		}
		if (!obj) EAntimagic &= ~W_ART;
	    }
	}

	/* intrinsics from the spfx field; there could be more than one */
	spfx = 0;
	if (oart) {
	    spfx = (wp_mask != W_ART) ? oart->spfx : oart->cspfx;
	} else if ((wp_mask == W_WEP ||
		    (wp_mask == W_SWAPWEP && (u.twoweap || !on))) &&
		   (otmp->oclass == WEAPON_CLASS || is_weptool(otmp)) &&
		   !is_ammo(otmp) && !is_missile(otmp)) {
	    if (otmp->oprops & ITEM_REFLECTION)
		spfx |= SPFX_REFLECT;
	    if (otmp->oprops & ITEM_ESP)
		spfx |= SPFX_ESP;
	    if (otmp->oprops & ITEM_SEARCHING)
		spfx |= SPFX_SEARCH;
	    if (otmp->oprops & ITEM_WARNING)
		spfx |= SPFX_WARN;
	    if (otmp->oprops & ITEM_STEALTH)
		spfx_stlth = TRUE;
	    if (otmp->oprops & ITEM_FUMBLING)
		spfx_fumbling = TRUE;
	    if (otmp->oprops & ITEM_HUNGER)
		spfx_hunger = TRUE;
	    if (otmp->oprops & ITEM_AGGRAVATE)
		spfx_aggravate = TRUE;
	}

	if (spfx && wp_mask == W_ART && !on) {
	    /* don't change any spfx also conferred by other artifacts */
	    struct obj* obj;
	    for (obj = invent; obj; obj = obj->nobj)
		if (obj != otmp && obj->oartifact) {
		    const struct artifact *art = get_artifact(obj);
		    spfx &= ~art->cspfx;
		}
	}

	if (spfx & SPFX_SEARCH) {
	    if (on) ESearching |= wp_mask;
	    else ESearching &= ~wp_mask;
	}
	if (spfx & SPFX_HALRES) {
	    /* make_hallucinated must (re)set the mask itself to get
	     * the display right */
	    /* hide message when restoring a game */
	    make_hallucinated((long)!on, side_effects, wp_mask);
	}
	if (spfx & SPFX_ESP) {
	    if (on) ETelepat |= wp_mask;
	    else ETelepat &= ~wp_mask;
	    see_monsters();
	}
	if (spfx_stlth) {
	    if (on) {
		if (side_effects && !EStealth && !HStealth && !BStealth) {
		    pline("You move very quietly.");
		    if (otmp->oprops & ITEM_STEALTH)
			otmp->oprops_known |= ITEM_STEALTH;
		}
		EStealth |= wp_mask;
	    } else {
		EStealth &= ~wp_mask;
		if (side_effects && !EStealth && !HStealth && !BStealth) {
		    pline("You sure are noisy.");
		    if (otmp->oprops & ITEM_STEALTH)
			otmp->oprops_known |= ITEM_STEALTH;
		}
	    }
	}
	if (spfx_fumbling) {
	    if (on) {
		if (!EFumbling && !(HFumbling & ~TIMEOUT))
		    incr_itimeout(&HFumbling, rnd(20));
		EFumbling |= wp_mask;
	    } else {
		EFumbling &= ~wp_mask;
		if (!EFumbling && ~(HFumbling & ~TIMEOUT))
		    HFumbling = EFumbling = 0;
	    }
	}
	if (spfx_hunger) {
	    if (on) EHunger |= wp_mask;
	    else EHunger &= ~wp_mask;
	}
	if (spfx_aggravate) {
	    if (on) EAggravate_monster |= wp_mask;
	    else EAggravate_monster &= ~wp_mask;
	}
	if (spfx & SPFX_DISPL) {
	    if (on) EDisplaced |= wp_mask;
	    else EDisplaced &= ~wp_mask;
	}
	if (spfx & SPFX_REGEN) {
	    if (on) ERegeneration |= wp_mask;
	    else ERegeneration &= ~wp_mask;
	}
	if (spfx & SPFX_TCTRL) {
	    if (on) ETeleport_control |= wp_mask;
	    else ETeleport_control &= ~wp_mask;
	}
	if (spfx & SPFX_WARN) {
	    if (spec_m2(otmp)) {
		if (on) {
			EWarn_of_mon |= wp_mask;
			flags.warntype |= spec_m2(otmp);
		} else {
			EWarn_of_mon &= ~wp_mask;
			flags.warntype &= ~spec_m2(otmp);
		}
	    } else {
		if (on) EWarning |= wp_mask;
		else EWarning &= ~wp_mask;
	    }
	    see_monsters();
	}
	if (spfx & SPFX_WARN_S) {
	    if (oart->mtype) {
		if (on) {
		    EWarn_of_mon |= wp_mask;
		} else {
		    EWarn_of_mon &= ~wp_mask;
		}
	    } else {
		if (on) EWarning |= wp_mask;
	    	else EWarning &= ~wp_mask;
	    }
	    see_monsters();
	}
	if (spfx & SPFX_EREGEN) {
	    if (on) EEnergy_regeneration |= wp_mask;
	    else EEnergy_regeneration &= ~wp_mask;
	}
	if (spfx & SPFX_HSPDAM) {
	    if (on) EHalf_spell_damage |= wp_mask;
	    else EHalf_spell_damage &= ~wp_mask;
	}
	if (spfx & SPFX_HPHDAM) {
	    if (on) EHalf_physical_damage |= wp_mask;
	    else EHalf_physical_damage &= ~wp_mask;
	}
	if (spfx & SPFX_XRAY) {
	    /* this assumes that no one else is using xray_range */
	    if (on) u.xray_range = 3;
	    else u.xray_range = -1;
	    vision_full_recalc = 1;
	}
	if ((spfx & SPFX_REFLECT) && (wp_mask & (W_WEP|W_SWAPWEP))) {
	    if (on) EReflecting |= wp_mask;
	    else EReflecting &= ~wp_mask;
	}

	if (wp_mask == W_ART && !on && oart && oart->inv_prop) {
	    /* might have to turn off invoked power too */
	    if (oart->inv_prop <= LAST_PROP &&
		(u.uprops[oart->inv_prop].extrinsic & W_ARTI))
		arti_invoke(otmp);
	}
}